

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_authorize_digest(mg_connection *c,FILE *fp)

{
  int iVar1;
  char *pcVar2;
  char local_46d8 [8];
  char nc [100];
  char local_4668 [8];
  char qop [100];
  char local_45f8 [8];
  char resp [100];
  char local_4588 [8];
  char cnonce [100];
  char local_4518 [8];
  char uri [16384];
  char nonce [100];
  char local_4a8 [8];
  char user [100];
  char local_438 [8];
  char f_domain [256];
  char ha1 [256];
  char f_user [256];
  char line [256];
  char *hdr;
  connection *conn;
  FILE *fp_local;
  mg_connection *c_local;
  
  if ((c == (mg_connection *)0x0) || (fp == (FILE *)0x0)) {
    c_local._4_4_ = 0;
  }
  else {
    pcVar2 = mg_get_header(c,"Authorization");
    if ((pcVar2 == (char *)0x0) || (iVar1 = mg_strncasecmp(pcVar2,"Digest ",7), iVar1 != 0)) {
      c_local._4_4_ = 0;
    }
    else {
      iVar1 = mg_parse_header(pcVar2,"username",local_4a8,100);
      if (iVar1 == 0) {
        c_local._4_4_ = 0;
      }
      else {
        iVar1 = mg_parse_header(pcVar2,"cnonce",local_4588,100);
        if (iVar1 == 0) {
          c_local._4_4_ = 0;
        }
        else {
          iVar1 = mg_parse_header(pcVar2,"response",local_45f8,100);
          if (iVar1 == 0) {
            c_local._4_4_ = 0;
          }
          else {
            iVar1 = mg_parse_header(pcVar2,"uri",local_4518,0x4000);
            if (iVar1 == 0) {
              c_local._4_4_ = 0;
            }
            else {
              iVar1 = mg_parse_header(pcVar2,"qop",local_4668,100);
              if (iVar1 == 0) {
                c_local._4_4_ = 0;
              }
              else {
                iVar1 = mg_parse_header(pcVar2,"nc",local_46d8,100);
                if (iVar1 == 0) {
                  c_local._4_4_ = 0;
                }
                else {
                  iVar1 = mg_parse_header(pcVar2,"nonce",uri + 0x3ff8,100);
                  if (iVar1 == 0) {
                    c_local._4_4_ = 0;
                  }
                  else {
                    do {
                      pcVar2 = fgets(f_user + 0xf8,0x100,(FILE *)fp);
                      if (pcVar2 == (char *)0x0) {
                        return 0;
                      }
                      iVar1 = __isoc99_sscanf(f_user + 0xf8,"%[^:]:%[^:]:%s",ha1 + 0xf8,local_438,
                                              f_domain + 0xf8);
                    } while (((iVar1 != 3) || (iVar1 = strcmp(local_4a8,ha1 + 0xf8), iVar1 != 0)) ||
                            (iVar1 = strcmp(*(char **)(c[1].request_method + 0x48),local_438),
                            iVar1 != 0));
                    c_local._4_4_ =
                         check_password(c->request_method,f_domain + 0xf8,local_4518,uri + 0x3ff8,
                                        local_46d8,local_4588,local_4668,local_45f8);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return c_local._4_4_;
}

Assistant:

int mg_authorize_digest(struct mg_connection *c, FILE *fp) {
  struct connection *conn = MG_CONN_2_CONN(c);
  const char *hdr;
  char line[256], f_user[256], ha1[256], f_domain[256], user[100], nonce[100],
       uri[MAX_REQUEST_SIZE], cnonce[100], resp[100], qop[100], nc[100];

  if (c == NULL || fp == NULL) return 0;
  if ((hdr = mg_get_header(c, "Authorization")) == NULL ||
      mg_strncasecmp(hdr, "Digest ", 7) != 0) return 0;
  if (!mg_parse_header(hdr, "username", user, sizeof(user))) return 0;
  if (!mg_parse_header(hdr, "cnonce", cnonce, sizeof(cnonce))) return 0;
  if (!mg_parse_header(hdr, "response", resp, sizeof(resp))) return 0;
  if (!mg_parse_header(hdr, "uri", uri, sizeof(uri))) return 0;
  if (!mg_parse_header(hdr, "qop", qop, sizeof(qop))) return 0;
  if (!mg_parse_header(hdr, "nc", nc, sizeof(nc))) return 0;
  if (!mg_parse_header(hdr, "nonce", nonce, sizeof(nonce))) return 0;

  while (fgets(line, sizeof(line), fp) != NULL) {
    if (sscanf(line, "%[^:]:%[^:]:%s", f_user, f_domain, ha1) == 3 &&
        !strcmp(user, f_user) &&
        // NOTE(lsm): due to a bug in MSIE, we do not compare URIs
        !strcmp(conn->server->config_options[AUTH_DOMAIN], f_domain))
      return check_password(c->request_method, ha1, uri,
                            nonce, nc, cnonce, qop, resp);
  }
  return MG_FALSE;
}